

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_conn.cc
# Opt level: O0

void __thiscall iqxmlrpc::Server_connection::Server_connection(Server_connection *this,Inet_addr *a)

{
  allocator_type local_26;
  value_type_conflict local_25 [13];
  Inet_addr *local_18;
  Inet_addr *a_local;
  Server_connection *this_local;
  
  this->_vptr_Server_connection = (_func_int **)&PTR___cxa_pure_virtual_00254400;
  local_18 = a;
  a_local = (Inet_addr *)this;
  iqnet::Inet_addr::Inet_addr(&this->peer_addr,a);
  this->server = (Server *)0x0;
  http::Packet_reader::Packet_reader(&this->preader);
  std::__cxx11::string::string((string *)&this->response);
  this->keep_alive = false;
  local_25[0] = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&this->read_buf_,0x10000,local_25,&local_26);
  std::allocator<char>::~allocator(&local_26);
  return;
}

Assistant:

Server_connection::Server_connection( const iqnet::Inet_addr& a ):
  peer_addr(a),
  server(0),
  keep_alive(false),
  read_buf_(65536, '\0')
{
}